

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int addAggInfoColumn(sqlite3 *db,AggInfo *pInfo)

{
  void *pvVar1;
  long in_RSI;
  long in_FS_OFFSET;
  int *unaff_retaddr;
  sqlite3 *in_stack_00000018;
  int i;
  int *pIdx;
  
  pIdx = *(int **)(in_FS_OFFSET + 0x28);
  pvVar1 = sqlite3ArrayAllocate(in_stack_00000018,db,pInfo._4_4_,unaff_retaddr,pIdx);
  *(void **)(in_RSI + 0x18) = pvVar1;
  if (*(int **)(in_FS_OFFSET + 0x28) == pIdx) {
    return -0x55555556;
  }
  __stack_chk_fail();
}

Assistant:

static int addAggInfoColumn(sqlite3 *db, AggInfo *pInfo){
  int i;
  pInfo->aCol = sqlite3ArrayAllocate(
       db,
       pInfo->aCol,
       sizeof(pInfo->aCol[0]),
       &pInfo->nColumn,
       &i
  );
  return i;
}